

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

void __thiscall
glcts::ProgramUniformCase::progUniformf
          (ProgramUniformCase *this,Functions *gl,GLuint prog,int arraySize,int *location,
          float *value)

{
  GLfloat *pGVar1;
  
  (*gl->programUniform1f)(prog,*location,*value);
  (*gl->programUniform2f)(prog,location[1],value[1],value[2]);
  (*gl->programUniform3f)(prog,location[2],value[3],value[4],value[5]);
  (*gl->programUniform4f)(prog,location[3],value[6],value[7],value[8],value[9]);
  (*gl->programUniform1fv)(prog,location[4],arraySize,value + 10);
  pGVar1 = value + (long)arraySize + 10;
  (*gl->programUniform2fv)(prog,location[6],arraySize,pGVar1);
  (*gl->programUniform3fv)(prog,location[8],arraySize,pGVar1 + arraySize * 2);
  (*gl->programUniform4fv)(prog,location[10],arraySize,pGVar1 + arraySize * 2 + arraySize * 3);
  return;
}

Assistant:

void progUniformf(const glw::Functions& gl, glw::GLuint prog, int arraySize, int* location, float* value)
	{
		gl.programUniform1f(prog, location[0], value[0]);
		value += 1;
		gl.programUniform2f(prog, location[1], value[0], value[1]);
		value += 2;
		gl.programUniform3f(prog, location[2], value[0], value[1], value[2]);
		value += 3;
		gl.programUniform4f(prog, location[3], value[0], value[1], value[2], value[3]);
		value += 4;

		gl.programUniform1fv(prog, location[4], arraySize, value);
		value += 1 * arraySize;
		gl.programUniform2fv(prog, location[6], arraySize, value);
		value += 2 * arraySize;
		gl.programUniform3fv(prog, location[8], arraySize, value);
		value += 3 * arraySize;
		gl.programUniform4fv(prog, location[10], arraySize, value);
	}